

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_TEXM3X3TEX(Context *ctx)

{
  RegisterList *item;
  RegisterList *pRVar1;
  uint uVar2;
  uint uVar3;
  size_t len;
  char *pcVar4;
  char *pcVar5;
  char sampler [64];
  char src3 [64];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char src4 [64];
  char dst [64];
  char code [512];
  
  if (ctx->texm3x3pad_src1 != -1) {
    ctx->metal_need_header_texture = 1;
    ctx->metal_need_header_geometric = 1;
    snprintf(code,0x10,"%u",(ulong)(uint)(ctx->dest_arg).regnum);
    snprintf(sampler,0x40,"%s%s","s",code);
    pcVar4 = "t";
    pcVar5 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar5 = "a";
    }
    snprintf(code,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_dst0);
    snprintf(src0,0x40,"%s%s",pcVar5,code);
    pcVar5 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar5 = "a";
    }
    snprintf(code,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_src0);
    snprintf(src1,0x40,"%s%s",pcVar5,code);
    pcVar5 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar5 = "a";
    }
    snprintf(code,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_dst1);
    snprintf(src2,0x40,"%s%s",pcVar5,code);
    pcVar5 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar5 = "a";
    }
    snprintf(code,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_src1);
    snprintf(src3,0x40,"%s%s",pcVar5,code);
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar4 = "a";
    }
    snprintf(code,0x10,"%u",(ulong)(uint)ctx->source_args[0].regnum);
    snprintf(src4,0x40,"%s%s",pcVar4,code);
    get_METAL_destarg_varname(ctx,dst,len);
    pRVar1 = (ctx->samplers).next;
    pcVar4 = "3D";
    if (pRVar1 != (RegisterList *)0x0) {
      uVar2 = (ctx->dest_arg).regnum | 0xa0000;
      while (uVar3 = pRVar1->regtype << 0x10 | pRVar1->regnum, uVar2 != uVar3) {
        if ((uVar2 < uVar3) || (pRVar1 = pRVar1->next, pRVar1 == (RegisterList *)0x0))
        goto LAB_00119094;
      }
      pcVar4 = "3D";
      if (pRVar1->index == 3) {
        pcVar4 = "Cube";
      }
    }
LAB_00119094:
    make_METAL_destarg_assign
              (ctx,code,0x200,
               "texture%s(%s, float3(dot(%s.xyz, %s.xyz), dot(%s.xyz, %s.xyz), dot(%s.xyz, %s.xyz)))"
               ,pcVar4,sampler,src0,src1,src2,src3,dst,src4);
    output_line(ctx,"%s",code);
  }
  return;
}

Assistant:

static void emit_METAL_TEXM3X3TEX(Context *ctx)
{
    if (ctx->texm3x3pad_src1 == -1)
        return;

    DestArgInfo *info = &ctx->dest_arg;
    char dst[64];
    char src0[64];
    char src1[64];
    char src2[64];
    char src3[64];
    char src4[64];
    char sampler[64];
    char code[512];

    ctx->metal_need_header_texture = 1;
    ctx->metal_need_header_geometric = 1;

    // !!! FIXME: this code counts on the register not having swizzles, etc.
    get_METAL_varname_in_buf(ctx, REG_TYPE_SAMPLER, info->regnum,
                            sampler, sizeof (sampler));

    get_METAL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_dst0,
                            src0, sizeof (src0));
    get_METAL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_src0,
                            src1, sizeof (src1));
    get_METAL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_dst1,
                            src2, sizeof (src2));
    get_METAL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_src1,
                            src3, sizeof (src3));
    get_METAL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->source_args[0].regnum,
                            src4, sizeof (src4));
    get_METAL_destarg_varname(ctx, dst, sizeof (dst));

    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER,
                                      info->regnum);
    const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);
    const char *ttypestr = (ttype == TEXTURE_TYPE_CUBE) ? "Cube" : "3D";

    make_METAL_destarg_assign(ctx, code, sizeof (code),
        "texture%s(%s,"
            " float3(dot(%s.xyz, %s.xyz),"
            " dot(%s.xyz, %s.xyz),"
            " dot(%s.xyz, %s.xyz)))",
        ttypestr, sampler, src0, src1, src2, src3, dst, src4);

    output_line(ctx, "%s", code);
}